

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::dht_announce_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_announce_alert *this)

{
  uint uVar1;
  _Alloc_hider _Var2;
  uint *puVar3;
  char *__s;
  size_t sVar4;
  ulong in_RCX;
  span<const_char> in;
  error_code ec;
  char addr_str [16];
  char msg [200];
  error_code local_148;
  string local_138;
  string local_118;
  char local_f8 [200];
  
  local_148.val_ = 0;
  local_148.failed_ = false;
  local_148.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  if ((this->ip).super_address.type_ == ipv6) {
    boost::asio::ip::address_v6::to_string_abi_cxx11_
              (&local_138,&(this->ip).super_address.ipv6_address_,&local_148);
  }
  else {
    puVar3 = (uint *)__errno_location();
    *puVar3 = 0;
    __s = inet_ntop(2,&(this->ip).super_address.ipv4_address_,(char *)&local_118,0x10);
    local_148.val_ = *puVar3;
    in_RCX = (ulong)(uint)local_148.val_;
    local_148.failed_ = local_148.val_ != 0;
    local_148.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    if (__s == (char *)0x0) {
      if (local_148.val_ == 0) {
        local_148.val_ = 0x16;
        local_148.failed_ = true;
        local_148._5_3_ = 0;
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,__s,__s + sVar4);
    }
  }
  _Var2._M_p = local_138._M_dataplus._M_p;
  uVar1 = this->port;
  in.m_len = in_RCX;
  in.m_ptr = (char *)0x14;
  aux::to_hex_abi_cxx11_(&local_118,(aux *)&this->info_hash,in);
  snprintf(local_f8,200,"incoming dht announce: %s:%d (%s)",_Var2._M_p,(ulong)uVar1,
           local_118._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar4 = strlen(local_f8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_f8,local_f8 + sVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_announce_alert::message() const
	{
		error_code ec;
		char msg[200];
		std::snprintf(msg, sizeof(msg), "incoming dht announce: %s:%d (%s)"
			, ip.to_string(ec).c_str(), port, aux::to_hex(info_hash).c_str());
		return msg;
	}